

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O1

void send_recv_start(void)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uv_handle_type uVar4;
  uv_loop_t *puVar5;
  uv_loop_t *loop;
  void *pvVar6;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  uv_write_t *req;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long *plVar10;
  test_ctx *ptVar11;
  uv_handle_t *handle;
  uv_pipe_t *puVar12;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_4c0 [64];
  char acStack_408 [8];
  uv_buf_t uStack_400;
  long lStack_3f0;
  long lStack_3e8;
  uv_thread_t uStack_3e0;
  uv_process_t uStack_3d8;
  uv_loop_t *puStack_370;
  undefined8 uStack_368;
  long lStack_360;
  undefined1 auStack_358 [800];
  undefined8 uStack_38;
  long lStack_30;
  long lStack_28;
  
  auStack_4c0._48_8_ = auStack_4c0._40_8_;
  iVar2 = uv_is_readable((uv_stream_t *)&ctx2.channel);
  if (iVar2 == 1) {
    iVar2 = uv_is_writable((uv_stream_t *)&ctx2.channel);
    if (iVar2 != 1) goto LAB_001a4ff5;
    iVar2 = uv_is_closing((uv_handle_t *)&ctx2.channel);
    if (iVar2 != 0) goto LAB_001a5004;
    iVar2 = uv_read_start((uv_stream_t *)&ctx2.channel,alloc_cb,read_cb);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    send_recv_start_cold_1();
LAB_001a4ff5:
    send_recv_start_cold_2();
LAB_001a5004:
    send_recv_start_cold_3();
  }
  send_recv_start_cold_4();
  uStack_38._0_4_ = 0x1a502c;
  uStack_38._4_4_ = 0;
  puVar5 = uv_default_loop();
  uStack_38._0_4_ = 0x1a5038;
  uStack_38._4_4_ = 0;
  run_ipc_send_recv_helper(puVar5,0);
  lStack_28 = 0;
  lStack_30 = 0;
  uStack_38._0_4_ = 0x1a5051;
  uStack_38._4_4_ = 0;
  puVar5 = uv_default_loop();
  uStack_38._0_4_ = 0x1a5065;
  uStack_38._4_4_ = 0;
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uStack_38._0_4_ = 0x1a506f;
  uStack_38._4_4_ = 0;
  uv_run(puVar5,UV_RUN_DEFAULT);
  lStack_28 = 0;
  uStack_38._0_4_ = 0x1a507d;
  uStack_38._4_4_ = 0;
  loop = uv_default_loop();
  uStack_38._0_4_ = 0x1a5085;
  uStack_38._4_4_ = 0;
  iVar2 = uv_loop_close(loop);
  lStack_30 = (long)iVar2;
  if (lStack_28 == lStack_30) {
    uStack_38._0_4_ = 0x1a509b;
    uStack_38._4_4_ = 0;
    uv_library_shutdown();
    return;
  }
  uStack_38 = ipc_send_recv_helper_threadproc;
  ipc_send_recv_helper_cold_2();
  puStack_370 = (uv_loop_t *)0x1a50ce;
  iVar2 = uv_loop_init((uv_loop_t *)auStack_358);
  lStack_360 = (long)iVar2;
  uStack_368 = 0;
  if (lStack_360 == 0) {
    puStack_370 = (uv_loop_t *)0x1a50f7;
    run_ipc_send_recv_helper((uv_loop_t *)auStack_358,1);
    lStack_360 = 0;
    uStack_368 = 0;
    puStack_370 = (uv_loop_t *)0x1a5117;
    iVar2 = uv_loop_close((uv_loop_t *)auStack_358);
    lStack_360 = (long)iVar2;
    uStack_368 = 0;
    if (lStack_360 == 0) {
      return;
    }
  }
  else {
    puStack_370 = (uv_loop_t *)0x1a5146;
    ipc_send_recv_helper_threadproc_cold_1();
    puStack_370 = (uv_loop_t *)0x1a5153;
    ipc_send_recv_helper_threadproc_cold_2();
  }
  iVar2 = (int)&lStack_360;
  puStack_370 = (uv_loop_t *)run_test;
  ipc_send_recv_helper_threadproc_cold_3();
  plVar10 = &lStack_3f0;
  puStack_370 = puVar5;
  if (iVar2 == 0) {
    uStack_400.len = 0x1a5222;
    spawn_helper(&ctx.channel,&uStack_3d8,"ipc_send_recv_helper");
    uStack_400.len = 0x1a5230;
    connect_cb(&ctx.connect_req,0);
LAB_001a5230:
    uStack_400.len = 0x1a5235;
    puVar5 = uv_default_loop();
    uStack_400.len = 0x1a523f;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    lStack_3f0 = (long)iVar3;
    lStack_3e8 = 0;
    if (lStack_3f0 != 0) {
      uStack_400.len = 0x1a52b6;
      run_test_cold_3();
LAB_001a52b6:
      uStack_400.len = 0x1a52c3;
      run_test_cold_4();
LAB_001a52c3:
      uStack_400.len = 0x1a52d0;
      run_test_cold_1();
      goto LAB_001a52d0;
    }
    lStack_3f0 = 2;
    lStack_3e8 = (long)recv_cb_count;
    if (lStack_3e8 != 2) goto LAB_001a52b6;
    if (iVar2 == 0) {
      return;
    }
    uStack_400.len = 0x1a5286;
    iVar2 = uv_thread_join(&uStack_3e0);
    lStack_3f0 = (long)iVar2;
    lStack_3e8 = 0;
    if (lStack_3f0 == 0) {
      return;
    }
  }
  else {
    uStack_400.len = 0x1a5188;
    iVar3 = uv_thread_create(&uStack_3e0,ipc_send_recv_helper_threadproc,(void *)0x2a);
    uStack_3d8.data = (void *)(long)iVar3;
    lStack_3f0 = 0;
    if (uStack_3d8.data != (void *)0x0) goto LAB_001a52c3;
    uStack_400.len = 0x1a51b0;
    uv_sleep(1000);
    uStack_400.len = 0x1a51b5;
    puVar5 = uv_default_loop();
    uStack_400.len = 0x1a51c9;
    iVar3 = uv_pipe_init(puVar5,&ctx.channel,1);
    uStack_3d8.data = (void *)(long)iVar3;
    lStack_3f0 = 0;
    if (uStack_3d8.data == (void *)0x0) {
      uStack_400.len = 0x1a5208;
      uv_pipe_connect(&ctx.connect_req,&ctx.channel,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_001a5230;
    }
LAB_001a52d0:
    uStack_400.len = 0x1a52dd;
    run_test_cold_2();
  }
  iVar2 = (int)&lStack_3e8;
  uStack_400.len = (size_t)connect_cb;
  run_test_cold_5();
  if ((uv_connect_t *)plVar10 == &ctx.connect_req) {
    uStack_400.base = (char *)(long)iVar2;
    if ((char *)(long)iVar2 != (char *)0x0) goto LAB_001a541f;
    uStack_400 = uv_buf_init(".",1);
    iVar2 = uv_write2(&ctx.write_req,(uv_stream_t *)&ctx,&uStack_400,1,&ctx.send.stream,
                      (uv_write_cb)0x0);
    acStack_408[0] = '\0';
    acStack_408[1] = '\0';
    acStack_408[2] = '\0';
    acStack_408[3] = '\0';
    acStack_408[4] = '\0';
    acStack_408[5] = '\0';
    acStack_408[6] = '\0';
    acStack_408[7] = '\0';
    if (iVar2 != 0) goto LAB_001a542e;
    uStack_400 = uv_buf_init(".",1);
    iVar2 = uv_write2(&ctx.write_req2,(uv_stream_t *)&ctx,&uStack_400,1,&ctx.send2.stream,
                      (uv_write_cb)0x0);
    acStack_408[0] = '\0';
    acStack_408[1] = '\0';
    acStack_408[2] = '\0';
    acStack_408[3] = '\0';
    acStack_408[4] = '\0';
    acStack_408[5] = '\0';
    acStack_408[6] = '\0';
    acStack_408[7] = '\0';
    if (iVar2 != 0) goto LAB_001a543d;
    iVar2 = uv_read_start((uv_stream_t *)&ctx,alloc_cb,recv_cb);
    acStack_408[0] = '\0';
    acStack_408[1] = '\0';
    acStack_408[2] = '\0';
    acStack_408[3] = '\0';
    acStack_408[4] = '\0';
    acStack_408[5] = '\0';
    acStack_408[6] = '\0';
    acStack_408[7] = '\0';
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    connect_cb_cold_1();
LAB_001a541f:
    connect_cb_cold_2();
LAB_001a542e:
    connect_cb_cold_3();
LAB_001a543d:
    connect_cb_cold_4();
  }
  pcVar7 = acStack_408;
  connect_cb_cold_5();
  extraout_RDX[1] = 8;
  ptVar11 = (test_ctx *)0x8;
  pvVar6 = malloc(8);
  *extraout_RDX = pvVar6;
  if (pvVar6 != (void *)0x0) {
    return;
  }
  alloc_cb_cold_1();
  pcVar8 = pcVar7;
  free((void *)*extraout_RDX_00);
  if (ptVar11 == &ctx) {
    while( true ) {
      lVar1 = (long)recv_cb_count + 1;
      puVar12 = (uv_pipe_t *)&ctx.recv2;
      if ((long)recv_cb_count == 0) {
        puVar12 = (uv_pipe_t *)&ctx.recv;
      }
      recv_cb_count = (int)lVar1;
      if (pcVar7 != (char *)0xfffffffffffff001) break;
      if (lVar1 != 2) {
        recv_cb_cold_7();
LAB_001a5631:
        recv_cb_cold_5();
LAB_001a563e:
        recv_cb_cold_2();
LAB_001a564b:
        recv_cb_cold_6();
LAB_001a5658:
        recv_cb_cold_4();
        goto LAB_001a5665;
      }
LAB_001a55e2:
      iVar2 = uv_pipe_pending_count(&ctx.channel);
      if (iVar2 < 1) {
        if (recv_cb_count != 2) {
          return;
        }
        uv_close((uv_handle_t *)&ctx,(uv_close_cb)0x0);
        return;
      }
    }
    if ((long)pcVar7 < 0) goto LAB_001a564b;
    iVar2 = uv_pipe_pending_count(&ctx.channel);
    if (iVar2 < 1) goto LAB_001a563e;
    uVar4 = uv_pipe_pending_type(&ctx.channel);
    if (uVar4 == ctx.expected_type) {
      if (uVar4 == UV_TCP) {
        iVar2 = uv_tcp_init(ctx.channel.loop,(uv_tcp_t *)puVar12);
      }
      else {
        if (uVar4 != UV_NAMED_PIPE) goto LAB_001a5672;
        iVar2 = uv_pipe_init(ctx.channel.loop,puVar12,0);
      }
      if (iVar2 == 0) {
        iVar2 = uv_accept((uv_stream_t *)&ctx,(uv_stream_t *)puVar12);
        if (iVar2 != 0) goto LAB_001a5631;
        goto LAB_001a55e2;
      }
      goto LAB_001a5658;
    }
LAB_001a5665:
    recv_cb_cold_3();
LAB_001a5672:
    abort();
  }
  recv_cb_cold_1();
  auStack_4c0._8_8_ = (uv_loop_t *)0x1a569b;
  pcVar9 = pcVar8;
  auStack_4c0._56_8_ = pcVar7;
  free((void *)*extraout_RDX_01);
  iVar2 = (int)pcVar9;
  if ((pcVar8 == (char *)0xfffffffffffff001) || (pcVar8 == (char *)0xffffffffffffff99)) {
    return;
  }
  auStack_4c0._40_8_ = pcVar8;
  auStack_4c0._24_8_ = (uv_close_cb)0x0;
  if (-1 < (long)pcVar8) {
    if (ptVar11 != (test_ctx *)&ctx2.channel) goto LAB_001a586e;
    auStack_4c0._8_8_ = (uv_loop_t *)0x1a56ec;
    iVar2 = uv_pipe_pending_count(&ctx2.channel);
    if (iVar2 < 1) {
      return;
    }
    ptVar11 = (test_ctx *)&ctx2.channel;
    while( true ) {
      read_cb_count = read_cb_count + 1;
      req = &ctx2.write_req2;
      if (read_cb_count == 2) {
        req = &ctx2.write_req;
      }
      puVar12 = (uv_pipe_t *)&ctx2.recv2;
      if (read_cb_count == 2) {
        puVar12 = (uv_pipe_t *)&ctx2.recv;
      }
      auStack_4c0._8_8_ = (uv_loop_t *)0x1a574b;
      uVar4 = uv_pipe_pending_type(&ctx2.channel);
      if (uVar4 != UV_NAMED_PIPE) break;
      auStack_4c0._8_8_ = (uv_loop_t *)0x1a577b;
      iVar2 = uv_pipe_init(ctx2.channel.loop,puVar12,0);
LAB_001a577b:
      auStack_4c0._24_8_ = SEXT48(iVar2);
      auStack_4c0._32_8_ = (uv__queue *)0x0;
      if ((uv_close_cb)auStack_4c0._24_8_ != (uv_close_cb)0x0) {
LAB_001a584b:
        auStack_4c0._8_8_ = (uv_loop_t *)0x1a585a;
        read_cb_cold_2();
        goto LAB_001a585a;
      }
      auStack_4c0._8_8_ = (uv_loop_t *)0x1a57a6;
      iVar2 = uv_accept((uv_stream_t *)&ctx2.channel,(uv_stream_t *)puVar12);
      auStack_4c0._24_8_ = SEXT48(iVar2);
      auStack_4c0._32_8_ = (uv__queue *)0x0;
      if ((uv_close_cb)auStack_4c0._24_8_ != (uv_close_cb)0x0) {
LAB_001a583c:
        auStack_4c0._8_8_ = (uv_loop_t *)0x1a584b;
        read_cb_cold_3();
        goto LAB_001a584b;
      }
      auStack_4c0._8_8_ = (uv_loop_t *)0x1a57cf;
      auStack_4c0._40_16_ = (undefined1  [16])uv_buf_init(".",1);
      auStack_4c0._8_8_ = (uv_loop_t *)0x1a57f2;
      iVar2 = uv_write2(req,(uv_stream_t *)&ctx2.channel,(uv_buf_t *)(auStack_4c0 + 0x28),1,
                        (uv_stream_t *)puVar12,write2_cb);
      auStack_4c0._24_8_ = SEXT48(iVar2);
      auStack_4c0._32_8_ = (uv__queue *)0x0;
      if ((uv_close_cb)auStack_4c0._24_8_ != (uv_close_cb)0x0) {
        auStack_4c0._8_8_ = (uv_loop_t *)0x1a583c;
        read_cb_cold_4();
        goto LAB_001a583c;
      }
      auStack_4c0._8_8_ = (uv_loop_t *)0x1a5816;
      iVar2 = uv_pipe_pending_count(&ctx2.channel);
      if (iVar2 < 1) {
        return;
      }
    }
    if (uVar4 == UV_TCP) {
      auStack_4c0._8_8_ = (uv_loop_t *)0x1a5768;
      iVar2 = uv_tcp_init(ctx2.channel.loop,(uv_tcp_t *)puVar12);
      goto LAB_001a577b;
    }
LAB_001a585a:
    auStack_4c0._8_8_ = (uv_loop_t *)0x1a585f;
    read_cb_cold_5();
  }
  iVar2 = (int)auStack_4c0 + 0x18;
  auStack_4c0._8_8_ = (uv_loop_t *)0x1a586e;
  read_cb_cold_6();
LAB_001a586e:
  auStack_4c0._8_8_ = write2_cb;
  read_cb_cold_1();
  auStack_4c0._0_8_ = SEXT48(iVar2);
  auStack_4c0._8_8_ = ptVar11;
  if ((void *)auStack_4c0._0_8_ != (void *)0x0) {
    handle = (uv_handle_t *)auStack_4c0;
    write2_cb_cold_1();
    iVar2 = uv_is_closing(handle);
    if (iVar2 == 0) {
      uv_close(handle,(uv_close_cb)0x0);
      return;
    }
    return;
  }
  write2_cb_called = write2_cb_called + 1;
  if ((write2_cb_called == 2) && (is_in_process != 0)) {
    uv_close(&ctx2.recv.handle,(uv_close_cb)0x0);
    uv_close(&ctx2.recv2.handle,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&ctx2.channel,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&ctx2,(uv_close_cb)0x0);
    return;
  }
  return;
}

Assistant:

static void send_recv_start(void) {
  int r;
  ASSERT_EQ(1, uv_is_readable((uv_stream_t*)&ctx2.channel));
  ASSERT_EQ(1, uv_is_writable((uv_stream_t*)&ctx2.channel));
  ASSERT_OK(uv_is_closing((uv_handle_t*)&ctx2.channel));

  r = uv_read_start((uv_stream_t*)&ctx2.channel, alloc_cb, read_cb);
  ASSERT_OK(r);
}